

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::ContextArrayPack::ContextArrayPack
          (ContextArrayPack *this,RenderContext *renderCtx,Context *drawContext)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int height;
  
  this->_vptr_ContextArrayPack = (_func_int **)&PTR__ContextArrayPack_00783610;
  this->m_renderCtx = renderCtx;
  this->m_ctx = drawContext;
  (this->m_arrays).
  super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_arrays).
  super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_arrays).
  super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_program = (ShaderProgram *)0x0;
  iVar1 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar1 = *(int *)CONCAT44(extraout_var,iVar1);
  iVar2 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  if (0x1ff < iVar1) {
    iVar1 = 0x200;
  }
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 4);
  height = 0x200;
  if (iVar2 < 0x200) {
    height = iVar2;
  }
  tcu::Surface::Surface(&this->m_screen,iVar1,height);
  return;
}

Assistant:

ContextArrayPack::ContextArrayPack (glu::RenderContext& renderCtx, sglr::Context& drawContext)
	: m_renderCtx	(renderCtx)
	, m_ctx			(drawContext)
	, m_program		(DE_NULL)
	, m_screen		(std::min(512, renderCtx.getRenderTarget().getWidth()), std::min(512, renderCtx.getRenderTarget().getHeight()))
{
}